

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O0

S2Cap * __thiscall S2Cell::GetCapBound(S2Cap *__return_storage_ptr__,S2Cell *this)

{
  char cVar1;
  S2Point local_78;
  int local_60;
  undefined1 local_59;
  int k;
  S2Point local_48;
  undefined1 local_30 [8];
  S2Point center;
  S2Cell *this_local;
  S2Cap *cap;
  
  cVar1 = this->face_;
  center.c_[2] = (VType)this;
  _k = R2Rect::GetCenter(&this->uv_);
  S2::FaceUVtoXYZ(&local_48,(int)cVar1,(R2Point *)&k);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            ((D *)local_30,(BasicVector<Vector3,_double,_3UL> *)&local_48);
  local_59 = 0;
  S2Cap::FromPoint(__return_storage_ptr__,(S2Point *)local_30);
  for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
    GetVertex(&local_78,this,local_60);
    S2Cap::AddPoint(__return_storage_ptr__,&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2Cell::GetCapBound() const {
  // Use the cell center in (u,v)-space as the cap axis.  This vector is
  // very close to GetCenter() and faster to compute.  Neither one of these
  // vectors yields the bounding cap with minimal surface area, but they
  // are both pretty close.
  //
  // It's possible to show that the two vertices that are furthest from
  // the (u,v)-origin never determine the maximum cap size (this is a
  // possible future optimization).

  S2Point center = S2::FaceUVtoXYZ(face_, uv_.GetCenter()).Normalize();
  S2Cap cap = S2Cap::FromPoint(center);
  for (int k = 0; k < 4; ++k) {
    cap.AddPoint(GetVertex(k));
  }
  return cap;
}